

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[83]>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char *op,
                   char (*rhs) [83])

{
  String *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<char[83],_true>((char (*) [83])in_stack_ffffffffffffff58);
  operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }